

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_pool_test.cc
# Opt level: O0

void __thiscall ccel_handler_pool_test::test_method(ccel_handler_pool_test *this)

{
  test_handler_class *a;
  handler_pool<test_handler_class> pool1;
  lazy_ostream *in_stack_fffffffffffffc48;
  undefined1 uVar1;
  undefined4 in_stack_fffffffffffffc50;
  log_level in_stack_fffffffffffffc54;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  begin *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  handler_pool<test_handler_class> *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  lazy_ostream *in_stack_fffffffffffffc90;
  handler_pool<test_handler_class> *in_stack_fffffffffffffc98;
  const_string *file;
  unit_test_log_t *this_00;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  lazy_ostream local_330 [2];
  assertion_result local_310;
  basic_cstring<const_char> local_2e8;
  begin *in_stack_fffffffffffffd28;
  unit_test_log_t *in_stack_fffffffffffffd30;
  basic_cstring<const_char> local_298 [3];
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_200 [2];
  undefined4 local_1dc;
  test_handler_class *local_1d8;
  unit_test_log_t local_1d0 [58];
  
  this_00 = local_1d0;
  ccel::handler_pool<test_handler_class>::handler_pool
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
  local_1dc = 1;
  local_1d8 = ccel::handler_pool<test_handler_class>::construct<int>
                        (in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  do {
    uVar1 = (undefined1)((ulong)in_stack_fffffffffffffc48 >> 0x38);
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffc90,
               (const_string *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (bool)uVar1);
    in_stack_fffffffffffffc90 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffda8,"a != nullptr",0xc);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
               ,0x67);
    in_stack_fffffffffffffc48 = (lazy_ostream *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffdd8,(lazy_ostream *)&stack0xfffffffffffffdb8
               ,&local_268,0x11,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x2226a5);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x2226b2);
    in_stack_fffffffffffffc8f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc8f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
             ,0x67);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffc60,
             (const_string *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             in_stack_fffffffffffffc54);
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             (char (*) [14])CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             (test_handler_class **)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc48);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_test_handler_class_*,_test_handler_class_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_test_handler_class_*,_test_handler_class_*const_&>
              *)0x2227aa);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]> *)
             0x2227b7);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
  ;
  do {
    uVar1 = (undefined1)((ulong)in_stack_fffffffffffffc48 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffc90,
               (const_string *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    test_handler_class::get_value(local_1d8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (bool)uVar1);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,"a->get_value() == 1",0x13);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
               ,0x67);
    in_stack_fffffffffffffc48 = (lazy_ostream *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_310,local_330,&local_350,0x13,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x2228d9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x2228e6);
    in_stack_fffffffffffffc5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc5f);
  ccel::handler_pool<test_handler_class>::~handler_pool
            ((handler_pool<test_handler_class> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( ccel_handler_pool_test)
{
  ccel::handler_pool<test_handler_class> pool1;
  auto a=pool1.construct(1);
  BOOST_CHECK(a != nullptr);
  BOOST_TEST_MESSAGE("Address of a:"<<a);
  BOOST_REQUIRE(a->get_value() == 1);
}